

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndMenuBar(void)

{
  ImGuiWindow *window;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  
  pIVar2 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (window->SkipItems == false) {
    bVar3 = NavMoveRequestButNoResultYet();
    if (((bVar3) && ((uint)pIVar2->NavMoveDir < 2)) &&
       (pIVar1 = pIVar2->NavWindow, (pIVar2->NavWindow->Flags & 0x10000000) != 0)) {
      do {
        pIVar4 = pIVar1;
        pIVar1 = pIVar4->ParentWindow;
        if (pIVar1 == (ImGuiWindow *)0x0) break;
      } while ((pIVar1->Flags & 0x10000000) != 0);
      if (((pIVar1 == window) && ((pIVar4->DC).ParentLayoutType == 0)) &&
         ((pIVar2->NavMoveFlags & 0x80) == 0)) {
        FocusWindow(window);
        SetNavID(window->NavLastIds[1],ImGuiNavLayer_Menu,0,window->NavRectRel + 1);
        pIVar2->NavMousePosDirty = true;
        pIVar2->NavDisableHighlight = true;
        pIVar2->NavDisableMouseHover = true;
        NavMoveRequestForward
                  (pIVar2->NavMoveDir,pIVar2->NavMoveClipDir,pIVar2->NavMoveFlags,
                   pIVar2->NavMoveScrollFlags);
      }
    }
    PopClipRect();
    PopID();
    (window->DC).MenuBarOffset.x = (window->DC).CursorPos.x - (window->Pos).x;
    (pIVar2->GroupStack).Data[(long)(pIVar2->GroupStack).Size + -1].EmitItem = false;
    EndGroup();
    (window->DC).LayoutType = 1;
    (window->DC).NavLayerCurrent = ImGuiNavLayer_Main;
    (window->DC).MenuBarAppending = false;
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}